

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_compress_status_t
lzham::create_init_params(init_params *params,lzham_compress_params *pParams)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  undefined4 local_1c;
  lzham_compress_status_t local_4;
  
  if ((*(uint *)(in_RSI + 4) < 0xf) || (0x1d < *(uint *)(in_RSI + 4))) {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  else if ((*(int *)(in_RSI + 0x10) == 0) ||
          (bVar1 = math::is_power_of_2(*(uint32 *)(in_RSI + 0x14)), bVar1)) {
    *(undefined4 *)(in_RDI + 0x10) = *(undefined4 *)(in_RSI + 4);
    if (*(uint *)(in_RSI + 0xc) < 0x11) {
      local_1c = *(undefined4 *)(in_RSI + 0xc);
    }
    else {
      local_1c = 0x10;
    }
    *(undefined4 *)(in_RDI + 8) = local_1c;
    *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RSI + 0x10);
    *(undefined4 *)(in_RDI + 0x1c) = *(undefined4 *)(in_RSI + 0x14);
    *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + 0x18);
    switch(*(undefined4 *)(in_RSI + 8)) {
    case 0:
      *(undefined4 *)(in_RDI + 0xc) = 0;
      break;
    case 1:
      *(undefined4 *)(in_RDI + 0xc) = 1;
      break;
    case 2:
      *(undefined4 *)(in_RDI + 0xc) = 2;
      break;
    case 3:
      *(undefined4 *)(in_RDI + 0xc) = 3;
      break;
    case 4:
      *(undefined4 *)(in_RDI + 0xc) = 4;
      break;
    default:
      return LZHAM_COMP_STATUS_INVALID_PARAMETER;
    }
    local_4 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
  }
  else {
    local_4 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  }
  return local_4;
}

Assistant:

static lzham_compress_status_t create_init_params(lzcompressor::init_params &params, const lzham_compress_params *pParams)
   {
      if ((pParams->m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      
      if (pParams->m_cpucache_total_lines)
      {
         if (!math::is_power_of_2(pParams->m_cpucache_line_size))
         {
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
         }
      }
         
      params.m_dict_size_log2 = pParams->m_dict_size_log2;
      params.m_max_helper_threads = LZHAM_MIN(LZHAM_MAX_HELPER_THREADS, pParams->m_max_helper_threads);
      params.m_num_cachelines = pParams->m_cpucache_total_lines;
      params.m_cacheline_size = pParams->m_cpucache_line_size;
      params.m_lzham_compress_flags = pParams->m_compress_flags;
      
      switch (pParams->m_level)
      {
         case LZHAM_COMP_LEVEL_FASTEST:   params.m_compression_level = cCompressionLevelFastest; break;
         case LZHAM_COMP_LEVEL_FASTER:    params.m_compression_level = cCompressionLevelFaster; break;
         case LZHAM_COMP_LEVEL_DEFAULT:   params.m_compression_level = cCompressionLevelDefault; break;
         case LZHAM_COMP_LEVEL_BETTER:    params.m_compression_level = cCompressionLevelBetter; break;
         case LZHAM_COMP_LEVEL_UBER:      params.m_compression_level = cCompressionLevelUber; break;
         default:
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      };
   
      return LZHAM_COMP_STATUS_SUCCESS;
   }